

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::cpp_unittest::MovableMessageTest_MoveConstructor_Test::TestBody
          (MovableMessageTest_MoveConstructor_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_6f8;
  Message local_6f0;
  TestAllTypes_NestedMessage *local_6e8;
  undefined1 local_6e0 [8];
  AssertionResult gtest_ar_1;
  Message local_6c8;
  TestAllTypes_NestedMessage *local_6c0;
  undefined1 local_6b8 [8];
  AssertionResult gtest_ar;
  TestAllTypes message2;
  TestAllTypes_NestedMessage *nested;
  undefined1 local_350 [8];
  TestAllTypes message1;
  MovableMessageTest_MoveConstructor_Test *this_local;
  
  message1.field_0._808_8_ = this;
  proto2_unittest::TestAllTypes::TestAllTypes((TestAllTypes *)local_350);
  TestUtil::SetAllFields<proto2_unittest::TestAllTypes>((TestAllTypes *)local_350);
  message2.field_0._808_8_ =
       proto2_unittest::TestAllTypes::optional_nested_message((TestAllTypes *)local_350);
  proto2_unittest::TestAllTypes::TestAllTypes
            ((TestAllTypes *)&gtest_ar.message_,(TestAllTypes *)local_350);
  TestUtil::ExpectAllFieldsSet<proto2_unittest::TestAllTypes>((TestAllTypes *)&gtest_ar.message_);
  local_6c0 = proto2_unittest::TestAllTypes::optional_nested_message
                        ((TestAllTypes *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<const_proto2_unittest::TestAllTypes_NestedMessage_*,_const_proto2_unittest::TestAllTypes_NestedMessage_*,_nullptr>
            ((EqHelper *)local_6b8,"nested","&message2.optional_nested_message()",
             (TestAllTypes_NestedMessage **)((long)&message2.field_0 + 0x328),&local_6c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6b8);
  if (!bVar1) {
    testing::Message::Message(&local_6c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_6b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/move_unittest.cc"
               ,0x27,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_6c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_6c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6b8);
  local_6e8 = proto2_unittest::TestAllTypes::optional_nested_message((TestAllTypes *)local_350);
  testing::internal::
  CmpHelperNE<proto2_unittest::TestAllTypes_NestedMessage_const*,proto2_unittest::TestAllTypes_NestedMessage_const*>
            ((internal *)local_6e0,"nested","&message1.optional_nested_message()",
             (TestAllTypes_NestedMessage **)((long)&message2.field_0 + 0x328),&local_6e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6e0);
  if (!bVar1) {
    testing::Message::Message(&local_6f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_6e0);
    testing::internal::AssertHelper::AssertHelper
              (&local_6f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/move_unittest.cc"
               ,0x28,pcVar2);
    testing::internal::AssertHelper::operator=(&local_6f8,&local_6f0);
    testing::internal::AssertHelper::~AssertHelper(&local_6f8);
    testing::Message::~Message(&local_6f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6e0);
  proto2_unittest::TestAllTypes::~TestAllTypes((TestAllTypes *)&gtest_ar.message_);
  proto2_unittest::TestAllTypes::~TestAllTypes((TestAllTypes *)local_350);
  return;
}

Assistant:

TEST(MovableMessageTest, MoveConstructor) {
  proto2_unittest::TestAllTypes message1;
  TestUtil::SetAllFields(&message1);
  const auto* nested = &message1.optional_nested_message();

  proto2_unittest::TestAllTypes message2(std::move(message1));
  TestUtil::ExpectAllFieldsSet(message2);

  // Check if the optional_nested_message was actually moved (and not just
  // copied).
  EXPECT_EQ(nested, &message2.optional_nested_message());
  EXPECT_NE(nested, &message1.optional_nested_message());
}